

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::GenerateHelperToArrayPushFastPath
          (Lowerer *this,Instr *instr,LabelInstr *bailOutLabelHelper)

{
  code *pcVar1;
  bool bVar2;
  Opnd *opndArg;
  Opnd *opndArg_00;
  undefined4 *puVar3;
  Instr *pIVar4;
  JnHelperMethod helperMethod;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  opndArg = IR::Instr::UnlinkSrc1(instr);
  opndArg_00 = IR::Instr::UnlinkSrc2(instr);
  if (opndArg_00->m_type == TyInt32) {
    local_34 = (opndArg->m_valueType).field_0;
    bVar2 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_34.field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3027,"(arrayHelperOpnd->GetValueType().IsLikelyNativeIntArray())",
                         "arrayHelperOpnd->GetValueType().IsLikelyNativeIntArray()");
      if (!bVar2) {
LAB_00576c1c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,opndArg_00);
    helperMethod = HelperArray_NativeIntPush;
  }
  else if ((byte)(opndArg_00->m_type - TyFloat32) < 2) {
    local_32 = (opndArg->m_valueType).field_0;
    bVar2 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_32.field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x302e,"(arrayHelperOpnd->GetValueType().IsLikelyNativeFloatArray())",
                         "arrayHelperOpnd->GetValueType().IsLikelyNativeFloatArray()");
      if (!bVar2) goto LAB_00576c1c;
      *puVar3 = 0;
    }
    LowererMD::LoadDoubleHelperArgument(&this->m_lowererMD,instr,opndArg_00);
    helperMethod = HelperArray_NativeFloatPush;
  }
  else {
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,opndArg_00);
    helperMethod = HelperArray_VarPush;
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,opndArg);
  LoadScriptContext(this,instr);
  pIVar4 = LowererMD::ChangeToHelperCall
                     (&this->m_lowererMD,instr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
                      (PropertySymOpnd *)0x0,false);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::GenerateHelperToArrayPushFastPath(IR::Instr * instr, IR::LabelInstr * bailOutLabelHelper)
{
    IR::Opnd * arrayHelperOpnd = instr->UnlinkSrc1();
    IR::Opnd * elementHelperOpnd = instr->UnlinkSrc2();
    IR::JnHelperMethod helperMethod;

    if(elementHelperOpnd->IsInt32())
    {
        Assert(arrayHelperOpnd->GetValueType().IsLikelyNativeIntArray());
        helperMethod = IR::HelperArray_NativeIntPush;

        m_lowererMD.LoadHelperArgument(instr, elementHelperOpnd);
    }
    else if(elementHelperOpnd->IsFloat())
    {
        Assert(arrayHelperOpnd->GetValueType().IsLikelyNativeFloatArray());
        helperMethod = IR::HelperArray_NativeFloatPush;

        m_lowererMD.LoadDoubleHelperArgument(instr, elementHelperOpnd);
    }
    else
    {
        helperMethod = IR::HelperArray_VarPush;
        m_lowererMD.LoadHelperArgument(instr, elementHelperOpnd);
    }

    m_lowererMD.LoadHelperArgument(instr, arrayHelperOpnd);
    LoadScriptContext(instr);
    return m_lowererMD.ChangeToHelperCall(instr, helperMethod);
}